

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_rfc6979_hmac_sha256_generate
               (secp256k1_rfc6979_hmac_sha256_t *rng,uchar *out,size_t outlen)

{
  int local_1c4;
  undefined1 local_1c0 [4];
  int now;
  secp256k1_hmac_sha256_t hmac_1;
  secp256k1_hmac_sha256_t hmac;
  size_t outlen_local;
  uchar *out_local;
  secp256k1_rfc6979_hmac_sha256_t *rng_local;
  
  hmac.outer.bytes = outlen;
  outlen_local = (size_t)out;
  if (rng->retry != 0) {
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->k,0x20);
    secp256k1_hmac_sha256_write((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->v,0x20);
    secp256k1_hmac_sha256_write((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,"",1);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->k);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->k,0x20);
    secp256k1_hmac_sha256_write((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->v,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256_t *)&hmac_1.outer.bytes,rng->v);
  }
  for (; hmac.outer.bytes != 0; hmac.outer.bytes = hmac.outer.bytes - (long)local_1c4) {
    local_1c4 = (int)hmac.outer.bytes;
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256_t *)local_1c0,rng->k,0x20);
    secp256k1_hmac_sha256_write((secp256k1_hmac_sha256_t *)local_1c0,rng->v,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256_t *)local_1c0,rng->v);
    if (0x20 < local_1c4) {
      local_1c4 = 0x20;
    }
    memcpy((void *)outlen_local,rng,(long)local_1c4);
    outlen_local = outlen_local + (long)local_1c4;
  }
  rng->retry = 1;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_generate(secp256k1_rfc6979_hmac_sha256_t *rng, unsigned char *out, size_t outlen) {
    /* RFC6979 3.2.h. */
    static const unsigned char zero[1] = {0x00};
    if (rng->retry) {
        secp256k1_hmac_sha256_t hmac;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_write(&hmac, zero, 1);
        secp256k1_hmac_sha256_finalize(&hmac, rng->k);
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    }

    while (outlen > 0) {
        secp256k1_hmac_sha256_t hmac;
        int now = outlen;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
        if (now > 32) {
            now = 32;
        }
        memcpy(out, rng->v, now);
        out += now;
        outlen -= now;
    }

    rng->retry = 1;
}